

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::AddForwardIterator<int*>
          (RepeatedField<int> *this,int *begin,int *end)

{
  bool bVar1;
  int iVar2;
  int new_size_00;
  difference_type dVar3;
  int *piVar4;
  int final_capacity;
  int *final_elements;
  int final_size;
  bool final_is_soo;
  int *piStack_38;
  int new_size;
  int *elem;
  int capacity;
  int old_size;
  bool is_soo;
  int *end_local;
  int *begin_local;
  RepeatedField<int> *this_local;
  
  capacity._3_1_ = RepeatedField<int>::is_soo(this);
  iVar2 = size(this,capacity._3_1_);
  elem._4_4_ = Capacity(this,capacity._3_1_);
  piStack_38 = unsafe_elements(this,capacity._3_1_);
  dVar3 = std::distance<int*>(begin,end);
  new_size_00 = iVar2 + (int)dVar3;
  if (elem._4_4_ < new_size_00) {
    Grow(this,capacity._3_1_,iVar2,new_size_00);
    capacity._3_1_ = false;
    piStack_38 = unsafe_elements(this,false);
    elem._4_4_ = Capacity(this,false);
  }
  iVar2 = ExchangeCurrentSize(this,capacity._3_1_,new_size_00);
  UninitializedCopy<int*>(begin,end,piStack_38 + iVar2);
  bVar1 = RepeatedField<int>::is_soo(this);
  if (capacity._3_1_ != bVar1) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x38e);
  }
  iVar2 = size(this,capacity._3_1_);
  if (new_size_00 != iVar2) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x390);
  }
  piVar4 = unsafe_elements(this,capacity._3_1_);
  if (piStack_38 != piVar4) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x392);
  }
  iVar2 = Capacity(this,capacity._3_1_);
  if (elem._4_4_ != iVar2) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x394);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::AddForwardIterator(Iter begin, Iter end) {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  int capacity = Capacity(is_soo);
  Element* elem = unsafe_elements(is_soo);
  int new_size = old_size + static_cast<int>(std::distance(begin, end));
  if (ABSL_PREDICT_FALSE(new_size > capacity)) {
    Grow(is_soo, old_size, new_size);
    is_soo = false;
    elem = unsafe_elements(is_soo);
    capacity = Capacity(is_soo);
  }
  UninitializedCopy(begin, end, elem + ExchangeCurrentSize(is_soo, new_size));

  // The below helps the compiler optimize dense loops.
  // Note: we can't call functions in PROTOBUF_ASSUME so use local variables.
  [[maybe_unused]] const bool final_is_soo = this->is_soo();
  PROTOBUF_ASSUME(is_soo == final_is_soo);
  [[maybe_unused]] const int final_size = size(is_soo);
  PROTOBUF_ASSUME(new_size == final_size);
  [[maybe_unused]] Element* const final_elements = unsafe_elements(is_soo);
  PROTOBUF_ASSUME(elem == final_elements);
  [[maybe_unused]] const int final_capacity = Capacity(is_soo);
  PROTOBUF_ASSUME(capacity == final_capacity);
}